

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::TestSpecParser::visitChar(TestSpecParser *this,char c)

{
  Mode MVar1;
  bool bVar2;
  
  MVar1 = this->m_mode;
  if (c == '\\' && MVar1 != EscapedName) {
    escape(this);
  }
  else {
    if (c == ',' && MVar1 != EscapedName) {
      bVar2 = separate(this);
      return bVar2;
    }
    if (MVar1 != EscapedName) {
      if (MVar1 == Name) {
        processNameChar(this,c);
      }
      else if (MVar1 == None) {
        if (c < '[') {
          if (c == ' ') {
            return true;
          }
          if (c == '\"') {
            this->m_mode = QuotedName;
          }
          else {
LAB_00127a66:
            this->m_mode = Name;
          }
        }
        else if (c == '[') {
          this->m_mode = Tag;
        }
        else {
          if (c != '~') goto LAB_00127a66;
          this->m_exclusion = true;
        }
      }
      else {
        bVar2 = processOtherChar(this,c);
        if (bVar2) {
          return true;
        }
      }
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&this->m_substring,c);
      switch(this->m_mode) {
      case None:
        bVar2 = c == '~';
        break;
      case Name:
        bVar2 = c == '[';
        break;
      case QuotedName:
        bVar2 = c == '\"';
        break;
      case Tag:
        bVar2 = (c + 0xa5U & 0xfd) == 0;
        break;
      case EscapedName:
        return true;
      default:
        goto switchD_00127a99_default;
      }
      if (bVar2) {
        return true;
      }
      goto switchD_00127a99_default;
    }
    endMode(this);
  }
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&this->m_substring,c);
switchD_00127a99_default:
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&this->m_patternName,c);
  this->m_realPatternPos = this->m_realPatternPos + 1;
  return true;
}

Assistant:

bool TestSpecParser::visitChar( char c ) {
        if( (m_mode != EscapedName) && (c == '\\') ) {
            escape();
            addCharToPattern(c);
            return true;
        }else if((m_mode != EscapedName) && (c == ',') )  {
            return separate();
        }

        switch( m_mode ) {
        case None:
            if( processNoneChar( c ) )
                return true;
            break;
        case Name:
            processNameChar( c );
            break;
        case EscapedName:
            endMode();
            addCharToPattern(c);
            return true;
        default:
        case Tag:
        case QuotedName:
            if( processOtherChar( c ) )
                return true;
            break;
        }

        m_substring += c;
        if( !isControlChar( c ) ) {
            m_patternName += c;
            m_realPatternPos++;
        }
        return true;
    }